

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccnr.cc
# Opt level: O0

void __thiscall CCNR::ls_solver::initialize_variable_datas(ls_solver *this)

{
  size_type __n;
  bool bVar1;
  reference plVar2;
  reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  long in_RDI;
  lit l;
  iterator __end2;
  iterator __begin2;
  vector<CCNR::lit,_std::allocator<CCNR::lit>_> *__range2;
  variable *vp;
  size_t c;
  size_t v;
  vector<CCNR::lit,_std::allocator<CCNR::lit>_> *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  uint local_48;
  __normal_iterator<CCNR::lit_*,_std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>_> local_30;
  reference local_28;
  reference local_20;
  size_type local_18;
  ulong local_10;
  
  for (local_10 = 1; local_10 <= *(ulong *)(in_RDI + 0x50); local_10 = local_10 + 1) {
    local_28 = std::vector<CCNR::variable,_std::allocator<CCNR::variable>_>::operator[]
                         ((vector<CCNR::variable,_std::allocator<CCNR::variable>_> *)(in_RDI + 0x20)
                          ,local_10);
    local_28->score = 0;
    local_20 = local_28;
    local_30._M_current =
         (lit *)std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>::begin(in_stack_ffffffffffffff98)
    ;
    std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>::end(in_stack_ffffffffffffff98);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<CCNR::lit_*,_std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>_>
                               *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                              (__normal_iterator<CCNR::lit_*,_std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>_>
                               *)in_stack_ffffffffffffff98), bVar1) {
      plVar2 = __gnu_cxx::
               __normal_iterator<CCNR::lit_*,_std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>_>::
               operator*(&local_30);
      __n = plVar2->var_num;
      local_48 = (uint)*(undefined8 *)plVar2;
      local_18 = (size_type)((int)local_48 >> 1);
      pvVar3 = std::vector<CCNR::clause,_std::allocator<CCNR::clause>_>::operator[]
                         ((vector<CCNR::clause,_std::allocator<CCNR::clause>_> *)(in_RDI + 0x38),
                          local_18);
      if (pvVar3->sat_count == 0) {
        pvVar3 = std::vector<CCNR::clause,_std::allocator<CCNR::clause>_>::operator[]
                           ((vector<CCNR::clause,_std::allocator<CCNR::clause>_> *)(in_RDI + 0x38),
                            local_18);
        local_20->score = pvVar3->weight + local_20->score;
      }
      else {
        pvVar3 = std::vector<CCNR::clause,_std::allocator<CCNR::clause>_>::operator[]
                           ((vector<CCNR::clause,_std::allocator<CCNR::clause>_> *)(in_RDI + 0x38),
                            local_18);
        if (pvVar3->sat_count == 1) {
          in_stack_ffffffffffffffa4 = local_48 & 1;
          pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                             ((vector<char,_std::allocator<char>_> *)(in_RDI + 0xe0),__n);
          if (in_stack_ffffffffffffffa4 == (int)*pvVar4) {
            pvVar3 = std::vector<CCNR::clause,_std::allocator<CCNR::clause>_>::operator[]
                               ((vector<CCNR::clause,_std::allocator<CCNR::clause>_> *)
                                (in_RDI + 0x38),local_18);
            local_20->score = local_20->score - pvVar3->weight;
          }
        }
      }
      __gnu_cxx::__normal_iterator<CCNR::lit_*,_std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>_>
      ::operator++(&local_30);
    }
  }
  for (local_10 = 1; local_10 <= *(ulong *)(in_RDI + 0x50); local_10 = local_10 + 1) {
    pvVar5 = std::vector<CCNR::variable,_std::allocator<CCNR::variable>_>::operator[]
                       ((vector<CCNR::variable,_std::allocator<CCNR::variable>_> *)(in_RDI + 0x20),
                        local_10);
    pvVar5->last_flip_step = 0;
  }
  for (local_10 = 1; local_10 <= *(ulong *)(in_RDI + 0x50); local_10 = local_10 + 1) {
    local_20 = std::vector<CCNR::variable,_std::allocator<CCNR::variable>_>::operator[]
                         ((vector<CCNR::variable,_std::allocator<CCNR::variable>_> *)(in_RDI + 0x20)
                          ,local_10);
    local_20->cc_value = true;
    if (local_20->score < 1) {
      local_20->is_in_ccd_vars = false;
    }
    else {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 (value_type_conflict1 *)in_stack_ffffffffffffff98);
      local_20->is_in_ccd_vars = true;
    }
  }
  pvVar5 = std::vector<CCNR::variable,_std::allocator<CCNR::variable>_>::operator[]
                     ((vector<CCNR::variable,_std::allocator<CCNR::variable>_> *)(in_RDI + 0x20),0);
  pvVar5->score = 0;
  pvVar5->cc_value = false;
  pvVar5->is_in_ccd_vars = false;
  pvVar5->last_flip_step = 0;
  return;
}

Assistant:

void ls_solver::initialize_variable_datas()
{
    size_t v, c;
    variable *vp;
    // scores
    for (v = 1; v <= _num_vars; v++) {
        vp = &(_vars[v]);
        vp->score = 0;
        for (lit l : vp->literals) {
            c = l.clause_num;
            if (0 == _clauses[c].sat_count) {
                vp->score += _clauses[c].weight;
            } else if (1 == _clauses[c].sat_count && l.sense == _solution[l.var_num]) {
                vp->score -= _clauses[c].weight;
            }
        }
    }
    // last flip step
    for (v = 1; v <= _num_vars; v++) {
        _vars[v].last_flip_step = 0;
    }
    // cc datas
    for (v = 1; v <= _num_vars; v++) {
        vp = &(_vars[v]);
        vp->cc_value = 1;
        if (vp->score > 0) //&&_vars[v].cc_value==1
        {
            _ccd_vars.push_back(v);
            vp->is_in_ccd_vars = 1;
        } else {
            vp->is_in_ccd_vars = 0;
        }
    }
    // the virtual var 0
    vp = &(_vars[0]);
    vp->score = 0;
    vp->cc_value = 0;
    vp->is_in_ccd_vars = 0;
    vp->last_flip_step = 0;
}